

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUserDefinedIO.cpp
# Opt level: O3

int vkt::tessellation::anon_unknown_1::numBasicSubobjects(VarType *type)

{
  Type TVar1;
  pointer pSVar2;
  int iVar3;
  VarType *type_00;
  int iVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  
  iVar5 = 1;
  for (; TVar1 = type->m_type, TVar1 == TYPE_ARRAY; type = (type->m_data).array.elementType) {
    iVar5 = iVar5 * (type->m_data).array.size;
  }
  if (TVar1 == TYPE_BASIC) {
    iVar4 = 1;
  }
  else if (TVar1 == TYPE_STRUCT) {
    pSVar2 = (((type->m_data).structPtr)->m_members).
             super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = (int)((long)(((type->m_data).structPtr)->m_members).
                        super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)pSVar2 >> 3) * -0x49249249
    ;
    if ((int)uVar6 < 1) {
      iVar4 = 0;
    }
    else {
      uVar7 = (ulong)(uVar6 & 0x7fffffff);
      type_00 = &pSVar2->m_type;
      iVar4 = 0;
      do {
        iVar3 = numBasicSubobjects(type_00);
        iVar4 = iVar4 + iVar3;
        type_00 = (VarType *)&type_00[2].m_data;
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
    }
  }
  else {
    iVar4 = -1;
  }
  return iVar4 * iVar5;
}

Assistant:

int numBasicSubobjects (const glu::VarType& type)
{
	if (type.isBasicType())
		return 1;
	else if (type.isArrayType())
		return type.getArraySize()*numBasicSubobjects(type.getElementType());
	else if (type.isStructType())
	{
		const glu::StructType&	structType	= *type.getStructPtr();
		int						result		= 0;
		for (int i = 0; i < structType.getNumMembers(); ++i)
			result += numBasicSubobjects(structType.getMember(i).getType());
		return result;
	}
	else
	{
		DE_ASSERT(false);
		return -1;
	}
}